

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

bool __thiscall mjs::object::has_property(object *this,wstring_view *name)

{
  int iVar1;
  
  while( true ) {
    iVar1 = (*this->_vptr_object[6])(this,name);
    if ((iVar1 != 0x10) || ((this->prototype_).pos_ == 0)) break;
    this = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->prototype_,this->heap_);
  }
  return iVar1 != 0x10;
}

Assistant:

bool object::has_property(const std::wstring_view& name) const {
    if (own_property_attributes(name) != property_attribute::invalid) {
        return true;
    }
    return prototype_ && prototype_.dereference(heap()).has_property(name);
}